

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O0

void __thiscall
s2coding::EncodeS2PointVectorFast
          (s2coding *this,Span<const_Vector3<double>_> points,Encoder *encoder)

{
  size_type sVar1;
  pointer src;
  Encoder *this_00;
  uint64 size_format;
  Encoder *encoder_local;
  Span<const_Vector3<double>_> points_local;
  
  this_00 = (Encoder *)points.len_;
  points_local.ptr_ = points.ptr_;
  encoder_local = (Encoder *)this;
  sVar1 = absl::Span<const_Vector3<double>_>::size((Span<const_Vector3<double>_> *)&encoder_local);
  Encoder::Ensure(this_00,sVar1 * 0x18 + 10);
  sVar1 = absl::Span<const_Vector3<double>_>::size((Span<const_Vector3<double>_> *)&encoder_local);
  Encoder::put_varint64(this_00,sVar1 << 3);
  src = absl::Span<const_Vector3<double>_>::data((Span<const_Vector3<double>_> *)&encoder_local);
  sVar1 = absl::Span<const_Vector3<double>_>::size((Span<const_Vector3<double>_> *)&encoder_local);
  Encoder::putn(this_00,src,sVar1 * 0x18);
  return;
}

Assistant:

void EncodeS2PointVectorFast(Span<const S2Point> points, Encoder* encoder) {
#ifndef IS_LITTLE_ENDIAN
  S2_LOG(FATAL) << "Not implemented on big-endian architectures";
#endif

  // This function always uses the UNCOMPRESSED encoding.  The header consists
  // of a varint64 in the following format:
  //
  //   bits 0-2:  encoding format (UNCOMPRESSED)
  //   bits 3-63: vector size
  //
  // This is followed by an array of S2Points in little-endian order.
  encoder->Ensure(Varint::kMax64 + points.size() * sizeof(S2Point));
  uint64 size_format = (points.size() << kEncodingFormatBits |
                        EncodedS2PointVector::UNCOMPRESSED);
  encoder->put_varint64(size_format);
  encoder->putn(points.data(), points.size() * sizeof(S2Point));
}